

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

uint32 __thiscall
Js::ByteCodeBufferBuilder::GetDebuggerScopeSlotArrayCount
          (ByteCodeBufferBuilder *this,FunctionBody *function)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ScopeObjectChain *pSVar4;
  List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *pLVar5;
  uint32 local_1c;
  uint debuggerScopeSlotArraySize;
  FunctionBody *function_local;
  ByteCodeBufferBuilder *this_local;
  
  if (function == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x6c4,"(function)","function");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_1c = 0;
  pSVar4 = FunctionBody::GetScopeObjectChain(function);
  if (pSVar4 != (ScopeObjectChain *)0x0) {
    pSVar4 = FunctionBody::GetScopeObjectChain(function);
    pLVar5 = Memory::
             WriteBarrierPtr<JsUtil::List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
             ::operator->(&pSVar4->pScopeChain);
    local_1c = JsUtil::ReadOnlyList<Js::DebuggerScope*,Memory::Recycler,DefaultComparer>::
               CountWhere<Js::ByteCodeBufferBuilder::GetDebuggerScopeSlotArrayCount(Js::FunctionBody*)::_lambda(Js::DebuggerScope*)_1_>
                         ((ReadOnlyList<Js::DebuggerScope*,Memory::Recycler,DefaultComparer> *)
                          pLVar5);
  }
  return local_1c;
}

Assistant:

uint32 GetDebuggerScopeSlotArrayCount(FunctionBody * function)
    {
        Assert(function);
        uint debuggerScopeSlotArraySize = 0;
        if (function->GetScopeObjectChain())
        {
            debuggerScopeSlotArraySize = function->GetScopeObjectChain()->pScopeChain->CountWhere([&](DebuggerScope* scope)
            {
                return scope->IsSlotScope();
            });
        }

        return debuggerScopeSlotArraySize;
    }